

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

uint16_t __thiscall BaseSocketImpl::GetSocketPort(BaseSocketImpl *this)

{
  int iVar1;
  long *plVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  undefined8 uVar6;
  long lVar7;
  long unaff_R14;
  string caAddrPeer;
  string servInfoPeer;
  socklen_t addLen;
  sockaddr_storage addrPe;
  long *local_120 [2];
  long local_110 [2];
  long *local_100 [2];
  long local_f0 [2];
  long *local_e0 [2];
  long local_d0 [2];
  socklen_t local_bc;
  long *local_b8;
  sockaddr local_b0 [8];
  
  local_bc = 0x80;
  iVar3 = getsockname(this->m_fSock,local_b0,&local_bc);
  if (iVar3 == 0) {
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct((ulong)local_100,'/');
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct((ulong)local_e0,' ');
    iVar3 = getnameinfo(local_b0,0x80,(char *)local_100[0],0x2e,(char *)local_e0[0],0x20,3);
    plVar2 = local_e0[0];
    if (iVar3 == 0) {
      local_120[0] = local_110;
      if (local_e0[0] == (long *)0x0) {
        lVar7 = 1;
      }
      else {
        sVar4 = strlen((char *)local_e0[0]);
        lVar7 = (long)plVar2 + sVar4;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,plVar2,lVar7);
      plVar2 = local_120[0];
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      *piVar5 = 0;
      unaff_R14 = strtol((char *)plVar2,(char **)&local_b8,10);
      if (local_b8 == plVar2) {
        std::__throw_invalid_argument("stoi");
LAB_001174e0:
        uVar6 = std::__throw_out_of_range("stoi");
        if (local_e0[0] != local_d0) {
          operator_delete(local_e0[0],local_d0[0] + 1);
        }
        if (local_100[0] != local_f0) {
          operator_delete(local_100[0],local_f0[0] + 1);
        }
        _Unwind_Resume(uVar6);
      }
      if (((int)unaff_R14 != unaff_R14) || (*piVar5 == 0x22)) goto LAB_001174e0;
      if (*piVar5 == 0) {
        *piVar5 = iVar1;
      }
      if (local_120[0] != local_110) {
        operator_delete(local_120[0],local_110[0] + 1);
      }
    }
    if (local_e0[0] != local_d0) {
      operator_delete(local_e0[0],local_d0[0] + 1);
    }
    if (local_100[0] != local_f0) {
      operator_delete(local_100[0],local_f0[0] + 1);
    }
    if (iVar3 == 0) {
      return (uint16_t)unaff_R14;
    }
  }
  return 0;
}

Assistant:

uint16_t BaseSocketImpl::GetSocketPort()
{
    struct sockaddr_storage addrPe;
    socklen_t addLen = sizeof(addrPe);
    if (::getsockname(m_fSock, reinterpret_cast<struct sockaddr*>(&addrPe), &addLen) == 0)  // Get our IP where the connection was established
    {
        string caAddrPeer(INET6_ADDRSTRLEN + 1, 0);
        string servInfoPeer(NI_MAXSERV, 0);
        if (::getnameinfo(reinterpret_cast<struct sockaddr*>(&addrPe), sizeof(struct sockaddr_storage), &caAddrPeer[0], INET6_ADDRSTRLEN, &servInfoPeer[0], NI_MAXSERV, NI_NUMERICHOST | NI_NUMERICSERV) == 0)
        {
            return static_cast<uint16_t>(stoi(&servInfoPeer[0]));
        }
    }

    return 0;
}